

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::transcode_uastc_to_bc7
               (unpacked_uastc_block *unpacked_src_blk,bc7_optimization_results *dst_blk)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  uint32_t uVar5;
  uint uVar6;
  byte *pbVar7;
  undefined8 *in_RSI;
  long in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float comp_bits;
  float fVar11;
  float fVar12;
  uint32_t i_16;
  uint32_t bc7_subset_index_3;
  color_quad_u8 bestMaxColor_4;
  color_quad_u8 bestMinColor_4;
  uint32_t best_pbits_4 [2];
  float xh_4 [4];
  float xl_4 [4];
  uint32_t astc_subset;
  bool invert_partition_2;
  uint32_t c_2;
  uint32_t best_p;
  uint32_t c_1;
  uint32_t best_err1;
  uint32_t best_err0;
  color32 *solid_color;
  uint32_t i_15;
  uint32_t c;
  uint32_t astc_part;
  uint32_t bc7_part;
  uint32_t common_pattern_k;
  uint32_t i_14;
  uint32_t i_13;
  uint32_t h;
  uint32_t l;
  uint32_t bc7_comp;
  uint32_t astc_comp;
  uint32_t i_12;
  uint32_t i_11;
  uint32_t bc7_subset_index_2;
  color_quad_u8 bestMaxColor_3;
  color_quad_u8 bestMinColor_3;
  uint32_t best_pbits_3 [2];
  uint32_t i_10;
  uint32_t subset_2;
  float xh_3 [4];
  float xl_3 [4];
  bool invert_partition_1;
  uint32_t i_9;
  uint32_t bc7_subset_index_1;
  uint32_t hi;
  uint32_t lo;
  uint32_t comp;
  uint32_t subset_1;
  uint32_t perm;
  uint32_t i_8;
  uint32_t i_7;
  uint32_t bc7_subset_index;
  color_quad_u8 bestMaxColor_2;
  color_quad_u8 bestMinColor_2;
  uint32_t best_pbits_2 [2];
  uint32_t v;
  uint32_t i_6;
  uint32_t subset;
  float xh_2 [4];
  float xl_2 [4];
  bool invert_partition;
  uint32_t i_5;
  uint32_t i_4;
  color_quad_u8 bestMaxColor_1;
  color_quad_u8 bestMinColor_1;
  uint32_t best_pbits_1 [2];
  float xh_1 [4];
  float xl_1 [4];
  uint32_t i_3;
  uint32_t i_2;
  uint8_t s_bc7_3_to_4 [8];
  uint32_t i_1;
  uint8_t s_bc7_2_to_4 [4];
  uint32_t i;
  uint8_t s_bc7_5_to_4 [32];
  color_quad_u8 bestMaxColor;
  color_quad_u8 bestMinColor;
  uint32_t best_pbits [2];
  float xh [4];
  float xl [4];
  uint32_t total_comps;
  uint32_t endpoint_range;
  uint32_t mode;
  uint32_t in_stack_fffffffffffffdc0;
  uint32_t in_stack_fffffffffffffdc4;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_220;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  float fVar13;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  uint32_t in_stack_fffffffffffffe10;
  uint32_t in_stack_fffffffffffffe14;
  float total_comps_00;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  uint uVar14;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1b8;
  uint local_1b4;
  uint local_1ac;
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  undefined1 local_180 [4];
  undefined1 local_17c [4];
  undefined4 local_178;
  undefined4 local_174;
  uint local_170;
  uint local_16c;
  float local_168 [7];
  undefined4 local_14c;
  byte local_13d;
  uint local_13c;
  uint local_12c;
  uint local_128;
  uint local_120;
  uint local_11c;
  uint local_118;
  undefined1 local_114 [4];
  undefined1 local_110 [4];
  undefined4 local_10c [2];
  uint local_104;
  uint local_100;
  uint local_fc;
  float local_f8 [7];
  undefined4 local_dc;
  byte local_d1;
  uint local_d0;
  uint local_cc;
  undefined1 local_c8 [4];
  undefined1 local_c4 [4];
  undefined4 local_c0;
  undefined4 local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  undefined4 local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  undefined4 local_9c;
  uint local_94;
  uint local_90;
  undefined8 local_8c;
  uint local_84;
  undefined4 local_80;
  uint local_7c;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  uint local_24;
  uint local_20;
  uint local_1c;
  undefined8 *local_18;
  long local_10;
  
  in_RSI[10] = 0;
  in_RSI[0xb] = 0;
  in_RSI[8] = 0;
  in_RSI[9] = 0;
  in_RSI[6] = 0;
  in_RSI[7] = 0;
  in_RSI[4] = 0;
  in_RSI[5] = 0;
  in_RSI[2] = 0;
  in_RSI[3] = 0;
  *in_RSI = 0;
  in_RSI[1] = 0;
  local_1c = *(uint *)(in_RDI + 0x68);
  local_20 = (uint)(byte)g_uastc_mode_endpoint_ranges[local_1c];
  local_24 = (uint)(byte)g_uastc_mode_comps[local_1c];
  local_18 = in_RSI;
  local_10 = in_RDI;
  switch(local_1c) {
  case 0:
  case 5:
  case 10:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x12:
    *(undefined4 *)in_RSI = 6;
    if (local_24 == 2) {
      local_38 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x15) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      local_48 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x16) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      local_2c = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x17) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      local_3c = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x18) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      local_44 = local_48;
      local_40 = local_48;
      local_34 = local_38;
      local_30 = local_38;
    }
    else {
      local_38 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x15) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      local_34 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x17) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      local_30 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x19) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      local_48 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x16) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      local_44 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x18) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      local_40 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(in_RDI + 0x1a) * 2 + (ulong)local_20 * 0x200] /
                 255.0;
      if (local_24 == 4) {
        local_2c = (float)(byte)g_astc_unquant
                                [(ulong)*(byte *)(in_RDI + 0x1b) * 2 + (ulong)local_20 * 0x200] /
                   255.0;
        local_3c = (float)(byte)g_astc_unquant
                                [(ulong)*(byte *)(in_RDI + 0x1c) * 2 + (ulong)local_20 * 0x200] /
                   255.0;
      }
      else {
        local_2c = 1.0;
        local_3c = 1.0;
      }
    }
    determine_unique_pbits
              (in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
               (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (uint32_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    *(undefined4 *)(local_18 + 5) = local_54;
    *(undefined4 *)((long)local_18 + 0x34) = local_58;
    if (local_24 == 3) {
      *(undefined1 *)((long)local_18 + 0x2b) = 0x7f;
      *(undefined1 *)((long)local_18 + 0x37) = 0x7f;
    }
    *(undefined4 *)(local_18 + 8) = local_50;
    *(undefined4 *)((long)local_18 + 0x44) = local_4c;
    if (local_1c == 0x12) {
      local_78 = 0x303020201010000;
      local_70 = 0x706060605050404;
      local_68 = 0xb0b0a0a09090908;
      local_60 = 0xf0f0e0e0d0d0c0c;
      for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
        *(undefined1 *)((long)local_18 + (ulong)local_7c + 8) =
             *(undefined1 *)((long)&local_78 + (ulong)*(byte *)(local_10 + 0x27 + (ulong)local_7c));
      }
    }
    else if (local_1c == 0xe) {
      local_80 = 0xf0a0500;
      for (local_84 = 0; local_84 < 0x10; local_84 = local_84 + 1) {
        *(undefined1 *)((long)local_18 + (ulong)local_84 + 8) =
             *(undefined1 *)((long)&local_80 + (ulong)*(byte *)(local_10 + 0x27 + (ulong)local_84));
      }
    }
    else if ((local_1c == 5) || (local_1c == 0xc)) {
      local_8c = 0xf0d0b0906040200;
      for (local_90 = 0; local_90 < 0x10; local_90 = local_90 + 1) {
        *(undefined1 *)((long)local_18 + (ulong)local_90 + 8) =
             *(undefined1 *)((long)&local_8c + (ulong)*(byte *)(local_10 + 0x27 + (ulong)local_90));
      }
    }
    else {
      for (local_94 = 0; local_94 < 0x10; local_94 = local_94 + 1) {
        *(undefined1 *)((long)local_18 + (ulong)local_94 + 8) =
             *(undefined1 *)(local_10 + 0x27 + (ulong)local_94);
      }
    }
    break;
  case 1:
    *(undefined4 *)in_RSI = 3;
    local_a8 = (float)*(byte *)(in_RDI + 0x15) / 255.0;
    local_a4 = (float)*(byte *)(in_RDI + 0x17) / 255.0;
    local_a0 = (float)*(byte *)(in_RDI + 0x19) / 255.0;
    local_9c = 0x3f800000;
    local_b8 = (float)*(byte *)(in_RDI + 0x16) / 255.0;
    local_b4 = (float)*(byte *)(in_RDI + 0x18) / 255.0;
    local_b0 = (float)*(byte *)(in_RDI + 0x1a) / 255.0;
    local_ac = 0x3f800000;
    memset(local_c4,0,4);
    memset(local_c8,0,4);
    determine_unique_pbits
              (in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
               (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (uint32_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    for (local_cc = 0; local_cc < 3; local_cc = local_cc + 1) {
      *(undefined1 *)((long)local_18 + (ulong)local_cc + 0x28) = local_c4[local_cc];
      *(undefined1 *)((long)local_18 + (ulong)local_cc + 0x34) = local_c8[local_cc];
      *(undefined1 *)((long)local_18 + (ulong)local_cc + 0x2c) = local_c4[local_cc];
      *(undefined1 *)((long)local_18 + (ulong)local_cc + 0x38) = local_c8[local_cc];
    }
    *(undefined4 *)(local_18 + 8) = local_c0;
    *(undefined4 *)((long)local_18 + 0x44) = local_bc;
    *(undefined4 *)(local_18 + 9) = local_c0;
    *(undefined4 *)((long)local_18 + 0x4c) = local_bc;
    for (local_d0 = 0; local_d0 < 0x10; local_d0 = local_d0 + 1) {
      *(undefined1 *)((long)local_18 + (ulong)local_d0 + 8) =
           *(undefined1 *)(local_10 + 0x27 + (ulong)local_d0);
    }
    break;
  case 2:
    *(undefined4 *)in_RSI = 1;
    *(uint *)((long)in_RSI + 4) =
         (uint)(byte)g_astc_bc7_common_partitions2[(ulong)*(uint *)(in_RDI + 0x6c) * 6];
    local_d1 = g_astc_bc7_common_partitions2[(ulong)*(uint *)(in_RDI + 0x6c) * 6 + 4] & 1;
    local_dc = 0x3f800000;
    local_f8[3] = 1.0;
    for (local_fc = 0; local_fc < 2; local_fc = local_fc + 1) {
      for (local_100 = 0; local_100 < 3; local_100 = local_100 + 1) {
        uVar14 = (uint)*(byte *)(local_10 + 0x15 + (ulong)(local_fc * 6 + local_100 * 2));
        local_f8[(ulong)local_100 + 4] = (float)(uVar14 << 4 | uVar14) / 255.0;
        local_104 = (uint)*(byte *)(local_10 + 0x16 + (ulong)(local_fc * 6 + local_100 * 2));
        local_104 = local_104 << 4 | local_104;
        local_f8[local_100] = (float)local_104 / 255.0;
      }
      memset(local_10c,0,8);
      memset(local_110,0,4);
      memset(local_114,0,4);
      determine_shared_pbits
                (in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
                 (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (uint32_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      if ((local_d1 & 1) == 0) {
        local_230 = local_fc;
      }
      else {
        local_230 = 1 - local_fc;
      }
      local_118 = local_230;
      for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
        *(undefined1 *)((long)local_18 + (ulong)local_11c + (ulong)local_230 * 4 + 0x28) =
             local_110[local_11c];
        *(undefined1 *)((long)local_18 + (ulong)local_11c + (ulong)local_230 * 4 + 0x34) =
             local_114[local_11c];
      }
      *(undefined4 *)(local_18 + (ulong)local_230 + 8) = local_10c[0];
    }
    for (local_120 = 0; local_120 < 0x10; local_120 = local_120 + 1) {
      *(undefined1 *)((long)local_18 + (ulong)local_120 + 8) =
           *(undefined1 *)(local_10 + 0x27 + (ulong)local_120);
    }
    break;
  case 3:
    *(undefined4 *)in_RSI = 2;
    *(uint *)((long)in_RSI + 4) =
         (uint)(byte)g_astc_bc7_common_partitions3[(ulong)*(uint *)(in_RDI + 0x6c) * 6];
    bVar1 = g_astc_bc7_common_partitions3[(ulong)*(uint *)(in_RDI + 0x6c) * 6 + 4];
    for (local_128 = 0; local_128 < 3; local_128 = local_128 + 1) {
      for (local_12c = 0; local_12c < 3; local_12c = local_12c + 1) {
        bVar2 = g_astc_unquant
                [(ulong)*(byte *)(in_RDI + 0x15 + (ulong)(local_12c * 2 + 1 + local_128 * 6)) * 2 +
                 (ulong)local_20 * 0x200];
        bVar3 = g_astc_to_bc7_partition_index_perm_tables[(ulong)local_128 + (ulong)bVar1 * 3];
        *(char *)((long)in_RSI + (ulong)local_12c + (ulong)(uint)bVar3 * 4 + 0x28) =
             (char)(((uint)(byte)g_astc_unquant
                                 [(ulong)*(byte *)(in_RDI + 0x15 +
                                                  (ulong)(local_12c * 2 + local_128 * 6)) * 2 +
                                  (ulong)local_20 * 0x200] * 0x1f + 0x7f) / 0xff);
        *(char *)((long)in_RSI + (ulong)local_12c + (ulong)(uint)bVar3 * 4 + 0x34) =
             (char)(((uint)bVar2 * 0x1f + 0x7f) / 0xff);
      }
    }
    for (local_13c = 0; local_13c < 0x10; local_13c = local_13c + 1) {
      *(undefined1 *)((long)in_RSI + (ulong)local_13c + 8) =
           *(undefined1 *)(in_RDI + 0x27 + (ulong)local_13c);
    }
    break;
  case 4:
    *(undefined4 *)in_RSI = 3;
    *(uint *)((long)in_RSI + 4) =
         (uint)(byte)g_astc_bc7_common_partitions2[(ulong)*(uint *)(in_RDI + 0x6c) * 6];
    local_13d = g_astc_bc7_common_partitions2[(ulong)*(uint *)(in_RDI + 0x6c) * 6 + 4] & 1;
    local_14c = 0x3f800000;
    local_168[3] = 1.0;
    for (local_16c = 0; local_16c < 2; local_16c = local_16c + 1) {
      for (local_170 = 0; local_170 < 3; local_170 = local_170 + 1) {
        local_168[(ulong)local_170 + 4] =
             (float)(byte)g_astc_unquant
                          [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(local_170 * 2 + local_16c * 6)
                                           ) * 2 + (ulong)local_20 * 0x200] / 255.0;
        local_168[local_170] =
             (float)(byte)g_astc_unquant
                          [(ulong)*(byte *)(local_10 + 0x15 +
                                           (ulong)(local_170 * 2 + local_16c * 6 + 1)) * 2 +
                           (ulong)local_20 * 0x200] / 255.0;
      }
      memset(&local_178,0,8);
      memset(local_17c,0,4);
      memset(local_180,0,4);
      determine_unique_pbits
                (in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
                 (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (uint32_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      if ((local_13d & 1) == 0) {
        local_234 = local_16c;
      }
      else {
        local_234 = 1 - local_16c;
      }
      for (local_188 = 0; local_188 < 3; local_188 = local_188 + 1) {
        *(undefined1 *)((long)local_18 + (ulong)local_188 + (ulong)local_234 * 4 + 0x28) =
             local_17c[local_188];
        *(undefined1 *)((long)local_18 + (ulong)local_188 + (ulong)local_234 * 4 + 0x34) =
             local_180[local_188];
      }
      *(undefined1 *)((long)local_18 + (ulong)local_234 * 4 + 0x2b) = 0x7f;
      *(undefined1 *)((long)local_18 + (ulong)local_234 * 4 + 0x37) = 0x7f;
      *(undefined4 *)(local_18 + (ulong)local_234 + 8) = local_178;
      *(undefined4 *)((long)local_18 + (ulong)local_234 * 8 + 0x44) = local_174;
    }
    for (local_18c = 0; local_18c < 0x10; local_18c = local_18c + 1) {
      *(undefined1 *)((long)local_18 + (ulong)local_18c + 8) =
           *(undefined1 *)(local_10 + 0x27 + (ulong)local_18c);
    }
    break;
  case 6:
  case 0xb:
  case 0xd:
  case 0x11:
    *(undefined4 *)in_RSI = 5;
    *(uint *)((long)in_RSI + 0x5c) = *(int *)(in_RDI + 0x10) + 1U & 3;
    if (local_24 == 2) {
      if (*(int *)(in_RDI + 0x10) != 3) {
        __assert_fail("unpacked_src_blk.m_astc.m_ccs == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x3379,
                      "bool basist::transcode_uastc_to_bc7(const unpacked_uastc_block &, bc7_optimization_results &)"
                     );
      }
      *(char *)(in_RSI + 5) =
           (char)((ulong)((uint)(byte)g_astc_unquant
                                      [(ulong)*(byte *)(in_RDI + 0x15) * 2 + (ulong)local_20 * 0x200
                                      ] * 0x7f + 0x7f) / 0xff);
      *(char *)((long)in_RSI + 0x34) =
           (char)((ulong)((uint)(byte)g_astc_unquant
                                      [(ulong)*(byte *)(in_RDI + 0x16) * 2 + (ulong)local_20 * 0x200
                                      ] * 0x7f + 0x7f) / 0xff);
      *(undefined1 *)((long)in_RSI + 0x29) = *(undefined1 *)(in_RSI + 5);
      *(undefined1 *)((long)in_RSI + 0x35) = *(undefined1 *)((long)in_RSI + 0x34);
      *(undefined1 *)((long)in_RSI + 0x2a) = *(undefined1 *)(in_RSI + 5);
      *(undefined1 *)((long)in_RSI + 0x36) = *(undefined1 *)((long)in_RSI + 0x34);
      *(undefined1 *)((long)in_RSI + 0x2b) =
           g_astc_unquant[(ulong)*(byte *)(in_RDI + 0x17) * 2 + (ulong)local_20 * 0x200];
      *(undefined1 *)((long)in_RSI + 0x37) =
           g_astc_unquant[(ulong)*(byte *)(in_RDI + 0x18) * 2 + (ulong)local_20 * 0x200];
    }
    else {
      for (local_190 = 0; local_190 < 4; local_190 = local_190 + 1) {
        local_194 = local_190;
        if (local_190 == *(uint *)(in_RDI + 0x10)) {
          local_194 = 3;
        }
        else if (local_190 == 3) {
          local_194 = *(uint *)(in_RDI + 0x10);
        }
        local_198 = 0xff;
        local_19c = 0xff;
        if (local_190 < local_24) {
          local_198 = (uint)(byte)g_astc_unquant
                                  [(ulong)*(byte *)(in_RDI + 0x15 + (ulong)(local_190 << 1)) * 2 +
                                   (ulong)local_20 * 0x200];
          local_19c = (uint)(byte)g_astc_unquant
                                  [(ulong)*(byte *)(in_RDI + 0x15 + (ulong)(local_190 * 2 + 1)) * 2
                                   + (ulong)local_20 * 0x200];
        }
        if (local_194 < 3) {
          local_198 = (local_198 * 0x7f + 0x7f) / 0xff;
          local_19c = (local_19c * 0x7f + 0x7f) / 0xff;
        }
        *(char *)((long)in_RSI + (ulong)local_194 + 0x28) = (char)local_198;
        *(char *)((long)in_RSI + (ulong)local_194 + 0x34) = (char)local_19c;
      }
    }
    if (local_1c == 0xd) {
      for (local_1a0 = 0; local_1a0 < 0x10; local_1a0 = local_1a0 + 1) {
        uVar4 = 0;
        if (*(char *)(in_RDI + 0x27 + (ulong)(local_1a0 << 1)) != '\0') {
          uVar4 = 3;
        }
        *(undefined1 *)((long)in_RSI + (ulong)local_1a0 + 8) = uVar4;
        uVar4 = 0;
        if (*(char *)(in_RDI + 0x27 + (ulong)(local_1a0 * 2 + 1)) != '\0') {
          uVar4 = 3;
        }
        *(undefined1 *)((long)in_RSI + (ulong)local_1a0 + 0x18) = uVar4;
      }
    }
    else {
      for (local_1a4 = 0; local_1a4 < 0x10; local_1a4 = local_1a4 + 1) {
        *(undefined1 *)((long)in_RSI + (ulong)local_1a4 + 8) =
             *(undefined1 *)(in_RDI + 0x27 + (ulong)(local_1a4 << 1));
        *(undefined1 *)((long)in_RSI + (ulong)local_1a4 + 0x18) =
             *(undefined1 *)(in_RDI + 0x27 + (ulong)(local_1a4 * 2 + 1));
      }
    }
    break;
  case 7:
    *(undefined4 *)in_RSI = 2;
    *(uint *)((long)in_RSI + 4) =
         (uint)(byte)g_bc7_3_astc2_common_partitions[(ulong)*(uint *)(in_RDI + 0x6c) * 6];
    for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
      uVar5 = bc7_convert_partition_index_3_to_2
                        (in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
      for (local_1b4 = 0; local_1b4 < 3; local_1b4 = local_1b4 + 1) {
        *(char *)((long)local_18 + (ulong)local_1b4 + (ulong)local_1ac * 4 + 0x28) =
             (char)((ulong)((uint)(byte)g_astc_unquant
                                        [(ulong)*(byte *)(local_10 + 0x15 +
                                                         (ulong)(local_1b4 * 2 + uVar5 * 6)) * 2 +
                                         (ulong)local_20 * 0x200] * 0x1f + 0x7f) / 0xff);
        *(char *)((long)local_18 + (ulong)local_1b4 + (ulong)local_1ac * 4 + 0x34) =
             (char)((ulong)((uint)(byte)g_astc_unquant
                                        [(ulong)*(byte *)(local_10 + 0x15 +
                                                         (ulong)(local_1b4 * 2 + 1 + uVar5 * 6)) * 2
                                         + (ulong)local_20 * 0x200] * 0x1f + 0x7f) / 0xff);
      }
    }
    for (local_1b8 = 0; local_1b8 < 0x10; local_1b8 = local_1b8 + 1) {
      *(undefined1 *)((long)local_18 + (ulong)local_1b8 + 8) =
           *(undefined1 *)(local_10 + 0x27 + (ulong)local_1b8);
    }
    break;
  case 8:
    pbVar7 = (byte *)(in_RDI + 0x70);
    uVar14 = (uint)*(ushort *)(g_bc7_mode_6_optimal_endpoints + (ulong)*pbVar7 * 8) +
             (uint)*(ushort *)(g_bc7_mode_6_optimal_endpoints + (ulong)*(byte *)(in_RDI + 0x71) * 8)
             + (uint)*(ushort *)
                      (g_bc7_mode_6_optimal_endpoints + (ulong)*(byte *)(in_RDI + 0x72) * 8) +
             (uint)*(ushort *)(g_bc7_mode_6_optimal_endpoints + (ulong)*(byte *)(in_RDI + 0x73) * 8)
    ;
    uVar6 = (uint)*(ushort *)(g_bc7_mode_6_optimal_endpoints + (ulong)*pbVar7 * 8 + 4) +
            (uint)*(ushort *)
                   (g_bc7_mode_6_optimal_endpoints + (ulong)*(byte *)(in_RDI + 0x71) * 8 + 4) +
            (uint)*(ushort *)
                   (g_bc7_mode_6_optimal_endpoints + (ulong)*(byte *)(in_RDI + 0x72) * 8 + 4) +
            (uint)*(ushort *)
                   (g_bc7_mode_6_optimal_endpoints + (ulong)*(byte *)(in_RDI + 0x73) * 8 + 4);
    if ((uVar14 == 0) || (uVar6 == 0)) {
      *(undefined4 *)in_RSI = 6;
      local_1d0 = (uint)(uVar6 < uVar14);
      for (local_1d4 = 0; local_1d4 < 4; local_1d4 = local_1d4 + 1) {
        *(undefined1 *)((long)in_RSI + (ulong)local_1d4 + 0x28) =
             *(undefined1 *)((ulong)pbVar7[local_1d4] * 8 + 0x6ff742 + (ulong)local_1d0 * 4);
        *(undefined1 *)((long)in_RSI + (ulong)local_1d4 + 0x34) =
             *(undefined1 *)((ulong)pbVar7[local_1d4] * 8 + 0x6ff743 + (ulong)local_1d0 * 4);
      }
      *(uint *)(in_RSI + 8) = local_1d0;
      *(uint *)((long)in_RSI + 0x44) = local_1d0;
      memset(in_RSI + 1,5,0x10);
    }
    else {
      *(undefined4 *)in_RSI = 5;
      for (local_1cc = 0; local_1cc < 3; local_1cc = local_1cc + 1) {
        *(undefined1 *)((long)in_RSI + (ulong)local_1cc + 0x28) =
             g_bc7_mode_5_optimal_endpoints[(ulong)pbVar7[local_1cc] * 4 + 2];
        *(undefined1 *)((long)in_RSI + (ulong)local_1cc + 0x34) =
             g_bc7_mode_5_optimal_endpoints[(ulong)pbVar7[local_1cc] * 4 + 3];
      }
      memset(in_RSI + 1,1,0x10);
      *(undefined1 *)((long)local_18 + 0x2b) = *(undefined1 *)(in_RDI + 0x73);
      *(undefined1 *)((long)local_18 + 0x37) = *(undefined1 *)(in_RDI + 0x73);
    }
    break;
  case 9:
  case 0x10:
    *(undefined4 *)in_RSI = 7;
    *(uint *)((long)in_RSI + 4) =
         (uint)(byte)g_astc_bc7_common_partitions2[(ulong)*(uint *)(in_RDI + 0x6c) * 6];
    bVar1 = g_astc_bc7_common_partitions2[(ulong)*(uint *)(in_RDI + 0x6c) * 6 + 4];
    for (uVar14 = 0; uVar14 < 2; uVar14 = uVar14 + 1) {
      if (local_24 == 2) {
        fVar8 = (float)(byte)g_astc_unquant
                             [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 << 2)) * 2 +
                              (ulong)local_20 * 0x200] / 255.0;
        fVar9 = (float)(byte)g_astc_unquant
                             [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 4 + 1)) * 2 +
                              (ulong)local_20 * 0x200] / 255.0;
        bVar2 = g_astc_unquant
                [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 4 + 2)) * 2 +
                 (ulong)local_20 * 0x200];
        bVar3 = g_astc_unquant
                [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 4 + 3)) * 2 +
                 (ulong)local_20 * 0x200];
        fVar11 = fVar9;
        fVar12 = fVar9;
        fVar10 = fVar8;
        comp_bits = fVar8;
      }
      else {
        fVar8 = (float)(byte)g_astc_unquant
                             [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 << 3)) * 2 +
                              (ulong)local_20 * 0x200] / 255.0;
        fVar10 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 8 + 2)) * 2 +
                               (ulong)local_20 * 0x200] / 255.0;
        comp_bits = (float)(byte)g_astc_unquant
                                 [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 8 + 4)) * 2 +
                                  (ulong)local_20 * 0x200] / 255.0;
        bVar2 = g_astc_unquant
                [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 8 + 6)) * 2 +
                 (ulong)local_20 * 0x200];
        fVar9 = (float)(byte)g_astc_unquant
                             [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 8 + 1)) * 2 +
                              (ulong)local_20 * 0x200] / 255.0;
        fVar11 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 8 + 3)) * 2 +
                               (ulong)local_20 * 0x200] / 255.0;
        fVar12 = (float)(byte)g_astc_unquant
                              [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 8 + 5)) * 2 +
                               (ulong)local_20 * 0x200] / 255.0;
        bVar3 = g_astc_unquant
                [(ulong)*(byte *)(local_10 + 0x15 + (ulong)(uVar14 * 8 + 7)) * 2 +
                 (ulong)local_20 * 0x200];
      }
      total_comps_00 = (float)bVar2 / 255.0;
      fVar13 = (float)bVar3 / 255.0;
      memset(&stack0xfffffffffffffdf0,0,8);
      memset(&local_214,0,4);
      memset(&local_218,0,4);
      determine_unique_pbits
                ((uint32_t)total_comps_00,(uint32_t)comp_bits,(float *)CONCAT44(fVar10,fVar8),
                 (float *)CONCAT44(fVar13,fVar12),(color_quad_u8 *)CONCAT44(fVar11,fVar9),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (uint32_t *)CONCAT44(uVar14,in_stack_fffffffffffffe20));
      local_238 = uVar14;
      if ((bVar1 & 1) != 0) {
        local_238 = 1 - uVar14;
      }
      *(undefined4 *)((long)local_18 + (ulong)local_238 * 4 + 0x28) = local_214;
      *(undefined4 *)((long)local_18 + (ulong)local_238 * 4 + 0x34) = local_218;
      *(undefined4 *)(local_18 + (ulong)local_238 + 8) = in_stack_fffffffffffffdf0;
      *(undefined4 *)((long)local_18 + (ulong)local_238 * 8 + 0x44) = in_stack_fffffffffffffdf4;
    }
    for (local_220 = 0; local_220 < 0x10; local_220 = local_220 + 1) {
      *(undefined1 *)((long)local_18 + (ulong)local_220 + 8) =
           *(undefined1 *)(local_10 + 0x27 + (ulong)local_220);
    }
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool transcode_uastc_to_bc7(const unpacked_uastc_block& unpacked_src_blk, bc7_optimization_results& dst_blk)
	{
		memset(&dst_blk, 0, sizeof(dst_blk));

		const uint32_t mode = unpacked_src_blk.m_mode;

		const uint32_t endpoint_range = g_uastc_mode_endpoint_ranges[mode];
		const uint32_t total_comps = g_uastc_mode_comps[mode];

		switch (mode)
		{
		case 0:
		case 5:
		case 10:
		case 12:
		case 14:
		case 15:
		case 18:
		{
			// MODE 0: DualPlane: 0, WeightRange: 8 (16), Subsets: 1, EndpointRange: 19 (192) - BC7 MODE6 RGB
			// MODE 5: DualPlane: 0, WeightRange : 5 (8), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE6 RGB
			// MODE 10 DualPlane: 0, WeightRange: 8 (16), Subsets: 1, EndpointRange: 13 (48) - BC7 MODE6
			// MODE 12: DualPlane: 0, WeightRange : 5 (8), Subsets : 1, EndpointRange : 19 (192) - BC7 MODE6
			// MODE 14: DualPlane: 0, WeightRange : 2 (4), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE6
			// MODE 18: DualPlane: 0, WeightRange : 11 (32), Subsets : 1, CEM : 8, EndpointRange : 11 (32) - BC7 MODE6
			// MODE 15: DualPlane: 0, WeightRange : 8 (16), Subsets : 1, CEM : 4 (LA Direct), EndpointRange : 20 (256) - BC7 MODE6
			dst_blk.m_mode = 6;

			float xl[4], xh[4];
			if (total_comps == 2)
			{
				xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant / 255.0f;
				xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant / 255.0f;

				xl[1] = xl[0];
				xh[1] = xh[0];

				xl[2] = xl[0];
				xh[2] = xh[0];

				xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant / 255.0f;
				xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant / 255.0f;
			}
			else
			{
				xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant / 255.0f;
				xl[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant / 255.0f;
				xl[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[4]].m_unquant / 255.0f;

				xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant / 255.0f;
				xh[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant / 255.0f;
				xh[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[5]].m_unquant / 255.0f;

				if (total_comps == 4)
				{
					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[6]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[7]].m_unquant / 255.0f;
				}
				else
				{
					xl[3] = 1.0f;
					xh[3] = 1.0f;
				}
			}

			uint32_t best_pbits[2];
			color_quad_u8 bestMinColor, bestMaxColor;
			determine_unique_pbits((total_comps == 2) ? 4 : total_comps, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

			dst_blk.m_low[0] = bestMinColor;
			dst_blk.m_high[0] = bestMaxColor;

			if (total_comps == 3)
			{
				dst_blk.m_low[0].m_c[3] = 127;
				dst_blk.m_high[0].m_c[3] = 127;
			}

			dst_blk.m_pbits[0][0] = best_pbits[0];
			dst_blk.m_pbits[0][1] = best_pbits[1];

			if (mode == 18)
			{
				const uint8_t s_bc7_5_to_4[32] = { 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 6, 7, 8, 9, 9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_5_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else if (mode == 14)
			{
				const uint8_t s_bc7_2_to_4[4] = { 0, 5, 10, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_2_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else if ((mode == 5) || (mode == 12))
			{
				const uint8_t s_bc7_3_to_4[8] = { 0, 2, 4, 6, 9, 11, 13, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_3_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];
			}

			break;
		}
		case 1:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE3
			// Mode 1 uses endpoint range 20 - no need to use ASTC dequant tables.
			dst_blk.m_mode = 3;

			float xl[4], xh[4];
			xl[0] = unpacked_src_blk.m_astc.m_endpoints[0] / 255.0f;
			xl[1] = unpacked_src_blk.m_astc.m_endpoints[2] / 255.0f;
			xl[2] = unpacked_src_blk.m_astc.m_endpoints[4] / 255.0f;
			xl[3] = 1.0f;

			xh[0] = unpacked_src_blk.m_astc.m_endpoints[1] / 255.0f;
			xh[1] = unpacked_src_blk.m_astc.m_endpoints[3] / 255.0f;
			xh[2] = unpacked_src_blk.m_astc.m_endpoints[5] / 255.0f;
			xh[3] = 1.0f;

			uint32_t best_pbits[2];
			color_quad_u8 bestMinColor, bestMaxColor;
			memset(&bestMinColor, 0, sizeof(bestMinColor));
			memset(&bestMaxColor, 0, sizeof(bestMaxColor));
			determine_unique_pbits(3, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

			for (uint32_t i = 0; i < 3; i++)
			{
				dst_blk.m_low[0].m_c[i] = bestMinColor.m_c[i];
				dst_blk.m_high[0].m_c[i] = bestMaxColor.m_c[i];
				dst_blk.m_low[1].m_c[i] = bestMinColor.m_c[i];
				dst_blk.m_high[1].m_c[i] = bestMaxColor.m_c[i];
			}
			dst_blk.m_pbits[0][0] = best_pbits[0];
			dst_blk.m_pbits[0][1] = best_pbits[1];
			dst_blk.m_pbits[1][0] = best_pbits[0];
			dst_blk.m_pbits[1][1] = best_pbits[1];

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 2:
		{
			// 2. DualPlane: 0, WeightRange : 5 (8), Subsets : 2, EndpointRange : 8 (16) - BC7 MODE1 
			dst_blk.m_mode = 1;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			float xl[4], xh[4];
			xl[3] = 1.0f;
			xh[3] = 1.0f;

			for (uint32_t subset = 0; subset < 2; subset++)
			{
				for (uint32_t i = 0; i < 3; i++)
				{
					uint32_t v = unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6];
					v = (v << 4) | v;
					xl[i] = v / 255.0f;

					v = unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6 + 1];
					v = (v << 4) | v;
					xh[i] = v / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_shared_pbits(3, 6, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - subset) : subset;

				for (uint32_t i = 0; i < 3; i++)
				{
					dst_blk.m_low[bc7_subset_index].m_c[i] = bestMinColor.m_c[i];
					dst_blk.m_high[bc7_subset_index].m_c[i] = bestMaxColor.m_c[i];
				}

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
			} // subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 3:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 3, EndpointRange : 7 (12) - BC7 MODE2
			dst_blk.m_mode = 2;
			dst_blk.m_partition = g_astc_bc7_common_partitions3[unpacked_src_blk.m_common_pattern].m_bc7;

			const uint32_t perm = g_astc_bc7_common_partitions3[unpacked_src_blk.m_common_pattern].m_astc_to_bc7_perm;

			for (uint32_t subset = 0; subset < 3; subset++)
			{
				for (uint32_t comp = 0; comp < 3; comp++)
				{
					uint32_t lo = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[comp * 2 + 0 + subset * 6]].m_unquant;
					uint32_t hi = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[comp * 2 + 1 + subset * 6]].m_unquant;

					// TODO: I think this can be improved by using tables like Basis Universal does with ETC1S conversion.
					lo = (lo * 31 + 127) / 255;
					hi = (hi * 31 + 127) / 255;

					const uint32_t bc7_subset_index = g_astc_to_bc7_partition_index_perm_tables[perm][subset];

					dst_blk.m_low[bc7_subset_index].m_c[comp] = (uint8_t)lo;
					dst_blk.m_high[bc7_subset_index].m_c[comp] = (uint8_t)hi;
				}
			}

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 4:
		{
			// 4. DualPlane: 0, WeightRange: 2 (4), Subsets: 2, EndpointRange: 12 (40) - BC7 MODE3
			dst_blk.m_mode = 3;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			float xl[4], xh[4];
			xl[3] = 1.0f;
			xh[3] = 1.0f;

			for (uint32_t subset = 0; subset < 2; subset++)
			{
				for (uint32_t i = 0; i < 3; i++)
				{
					xl[i] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6]].m_unquant / 255.0f;
					xh[i] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6 + 1]].m_unquant / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_unique_pbits(3, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - subset) : subset;

				for (uint32_t i = 0; i < 3; i++)
				{
					dst_blk.m_low[bc7_subset_index].m_c[i] = bestMinColor.m_c[i];
					dst_blk.m_high[bc7_subset_index].m_c[i] = bestMaxColor.m_c[i];
				}
				dst_blk.m_low[bc7_subset_index].m_c[3] = 127;
				dst_blk.m_high[bc7_subset_index].m_c[3] = 127;

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
				dst_blk.m_pbits[bc7_subset_index][1] = best_pbits[1];

			} // subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 6:
		case 11:
		case 13:
		case 17:
		{
			// MODE 6: DualPlane: 1, WeightRange : 2 (4), Subsets : 1, EndpointRange : 18 (160) - BC7 MODE5 RGB
			// MODE 11: DualPlane: 1, WeightRange: 2 (4), Subsets: 1, EndpointRange: 13 (48) - BC7 MODE5
			// MODE 13: DualPlane: 1, WeightRange: 0 (2), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE5
			// MODE 17: DualPlane: 1, WeightRange: 2 (4), Subsets: 1, CEM: 4 (LA Direct), EndpointRange: 20 (256) - BC7 MODE5
			dst_blk.m_mode = 5;
			dst_blk.m_rotation = (unpacked_src_blk.m_astc.m_ccs + 1) & 3;

			if (total_comps == 2)
			{
				assert(unpacked_src_blk.m_astc.m_ccs == 3);

				dst_blk.m_low->m_c[0] = (uint8_t)((g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant * 127 + 127) / 255);
				dst_blk.m_high->m_c[0] = (uint8_t)((g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant * 127 + 127) / 255);

				dst_blk.m_low->m_c[1] = dst_blk.m_low->m_c[0];
				dst_blk.m_high->m_c[1] = dst_blk.m_high->m_c[0];

				dst_blk.m_low->m_c[2] = dst_blk.m_low->m_c[0];
				dst_blk.m_high->m_c[2] = dst_blk.m_high->m_c[0];

				dst_blk.m_low->m_c[3] = (uint8_t)(g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant);
				dst_blk.m_high->m_c[3] = (uint8_t)(g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant);
			}
			else
			{
				for (uint32_t astc_comp = 0; astc_comp < 4; astc_comp++)
				{
					uint32_t bc7_comp = astc_comp;
					// ASTC and BC7 handle dual plane component rotations differently:
					// ASTC: 2nd plane separately interpolates the CCS channel.
					// BC7: 2nd plane channel is swapped with alpha, 2nd plane controls alpha interpolation, then we swap alpha with the desired channel.
					if (astc_comp == (uint32_t)unpacked_src_blk.m_astc.m_ccs)
						bc7_comp = 3;
					else if (astc_comp == 3)
						bc7_comp = unpacked_src_blk.m_astc.m_ccs;

					uint32_t l = 255, h = 255;
					if (astc_comp < total_comps)
					{
						l = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[astc_comp * 2 + 0]].m_unquant;
						h = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[astc_comp * 2 + 1]].m_unquant;
					}

					if (bc7_comp < 3)
					{
						l = (l * 127 + 127) / 255;
						h = (h * 127 + 127) / 255;
					}

					dst_blk.m_low->m_c[bc7_comp] = (uint8_t)l;
					dst_blk.m_high->m_c[bc7_comp] = (uint8_t)h;
				}
			}

			if (mode == 13)
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2] ? 3 : 0;
					dst_blk.m_alpha_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2 + 1] ? 3 : 0;
				}
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2];
					dst_blk.m_alpha_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2 + 1];
				}
			}

			break;
		}
		case 7:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 2, EndpointRange : 12 (40) - BC7 MODE2
			dst_blk.m_mode = 2;
			dst_blk.m_partition = g_bc7_3_astc2_common_partitions[unpacked_src_blk.m_common_pattern].m_bc73;

			const uint32_t common_pattern_k = g_bc7_3_astc2_common_partitions[unpacked_src_blk.m_common_pattern].k;

			for (uint32_t bc7_part = 0; bc7_part < 3; bc7_part++)
			{
				const uint32_t astc_part = bc7_convert_partition_index_3_to_2(bc7_part, common_pattern_k);

				for (uint32_t c = 0; c < 3; c++)
				{
					dst_blk.m_low[bc7_part].m_c[c] = (g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[c * 2 + 0 + astc_part * 6]].m_unquant * 31 + 127) / 255;
					dst_blk.m_high[bc7_part].m_c[c] = (g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[c * 2 + 1 + astc_part * 6]].m_unquant * 31 + 127) / 255;
				}
			}

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case UASTC_MODE_INDEX_SOLID_COLOR:
		{
			// Void-Extent: Solid Color RGBA (BC7 MODE5 or MODE6)
			const color32& solid_color = unpacked_src_blk.m_solid_color;

			uint32_t best_err0 = g_bc7_mode_6_optimal_endpoints[solid_color.r][0].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.g][0].m_error +
				g_bc7_mode_6_optimal_endpoints[solid_color.b][0].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.a][0].m_error;

			uint32_t best_err1 = g_bc7_mode_6_optimal_endpoints[solid_color.r][1].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.g][1].m_error +
				g_bc7_mode_6_optimal_endpoints[solid_color.b][1].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.a][1].m_error;

			if (best_err0 > 0 && best_err1 > 0)
			{
				dst_blk.m_mode = 5;

				for (uint32_t c = 0; c < 3; c++)
				{
					dst_blk.m_low[0].m_c[c] = g_bc7_mode_5_optimal_endpoints[solid_color.c[c]].m_lo;
					dst_blk.m_high[0].m_c[c] = g_bc7_mode_5_optimal_endpoints[solid_color.c[c]].m_hi;
				}

				memset(dst_blk.m_selectors, BC7ENC_MODE_5_OPTIMAL_INDEX, 16);

				dst_blk.m_low[0].m_c[3] = solid_color.c[3];
				dst_blk.m_high[0].m_c[3] = solid_color.c[3];

				//memset(dst_blk.m_alpha_selectors, 0, 16);
			}
			else
			{
				dst_blk.m_mode = 6;

				uint32_t best_p = 0;
				if (best_err1 < best_err0)
					best_p = 1;

				for (uint32_t c = 0; c < 4; c++)
				{
					dst_blk.m_low[0].m_c[c] = g_bc7_mode_6_optimal_endpoints[solid_color.c[c]][best_p].m_lo;
					dst_blk.m_high[0].m_c[c] = g_bc7_mode_6_optimal_endpoints[solid_color.c[c]][best_p].m_hi;
				}

				dst_blk.m_pbits[0][0] = best_p;
				dst_blk.m_pbits[0][1] = best_p;
				memset(dst_blk.m_selectors, BC7ENC_MODE_6_OPTIMAL_INDEX, 16);
			}

			break;
		}
		case 9:
		case 16:
		{
			// 9. DualPlane: 0, WeightRange : 2 (4), Subsets : 2, EndpointRange : 8 (16) - BC7 MODE7
			// 16. DualPlane: 0, WeightRange: 2 (4), Subsets: 2, CEM: 4 (LA Direct), EndpointRange: 20 (256) - BC7 MODE7

			dst_blk.m_mode = 7;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			for (uint32_t astc_subset = 0; astc_subset < 2; astc_subset++)
			{
				float xl[4], xh[4];

				if (total_comps == 2)
				{
					xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0 + astc_subset * 4]].m_unquant / 255.0f;
					xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1 + astc_subset * 4]].m_unquant / 255.0f;

					xl[1] = xl[0];
					xh[1] = xh[0];

					xl[2] = xl[0];
					xh[2] = xh[0];

					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2 + astc_subset * 4]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3 + astc_subset * 4]].m_unquant / 255.0f;
				}
				else
				{
					xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0 + astc_subset * 8]].m_unquant / 255.0f;
					xl[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2 + astc_subset * 8]].m_unquant / 255.0f;
					xl[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[4 + astc_subset * 8]].m_unquant / 255.0f;
					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[6 + astc_subset * 8]].m_unquant / 255.0f;

					xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1 + astc_subset * 8]].m_unquant / 255.0f;
					xh[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3 + astc_subset * 8]].m_unquant / 255.0f;
					xh[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[5 + astc_subset * 8]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[7 + astc_subset * 8]].m_unquant / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_unique_pbits(4, 5, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - astc_subset) : astc_subset;

				dst_blk.m_low[bc7_subset_index] = bestMinColor;
				dst_blk.m_high[bc7_subset_index] = bestMaxColor;

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
				dst_blk.m_pbits[bc7_subset_index][1] = best_pbits[1];
			} // astc_subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		default:
			return false;
		}

		return true;
	}